

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void init_tile_pack_bs_params
               (AV1_COMP *cpi,uint8_t *dst,aom_write_bit_buffer *saved_wb,
               PackBSParams *pack_bs_params_arr,uint8_t obu_extn_header)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  long lVar5;
  size_t sVar6;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 in_R8B;
  size_t tile_buf_size;
  PackBSParams *pack_bs_params_2;
  int is_last_tg;
  PackBSParams *pack_bs_params_1;
  int frame_size_mi;
  size_t remain_buf_size;
  size_t max_buf_size;
  size_t tg_buf_size [512];
  int is_last_tile_in_tg;
  int tile_size_mi;
  PackBSParams *pack_bs_params;
  TileInfo *tile_info;
  int new_tg;
  int tile_count_in_tg;
  int tg_idx;
  int tile_idx;
  int tg_size_mi [512];
  uint8_t *tile_data_curr;
  uint8_t *tile_dst;
  int tg_size_in_tiles;
  int num_tg_hdrs;
  int num_tiles;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  size_t local_18a8;
  size_t local_18a0;
  undefined1 local_1898 [4];
  int in_stack_ffffffffffffe76c;
  PackBSParams *in_stack_ffffffffffffe770;
  MACROBLOCKD *in_stack_ffffffffffffe778;
  AV1_COMP *in_stack_ffffffffffffe780;
  int local_890;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868 [514];
  long local_60;
  long local_58;
  int local_4c;
  int local_48;
  int local_44;
  int *local_40;
  long local_38;
  long local_30;
  undefined1 local_21;
  long local_20;
  undefined8 local_18;
  long local_8;
  
  local_30 = in_RDI + 0x151d0;
  local_38 = in_RDI + 0x3bf80;
  local_40 = (int *)(in_RDI + 0x42020);
  local_44 = *local_40 * *(int *)(in_RDI + 0x42024);
  local_48 = *(int *)(in_RDI + 0x9d4c4);
  local_4c = (local_44 + local_48 + -1) / local_48;
  local_60 = in_RSI;
  local_58 = in_RSI;
  local_21 = in_R8B;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  memset(local_868,0,0x800);
  local_870 = 0;
  local_874 = 0;
  local_878 = 1;
  for (local_86c = 0; local_86c < local_44; local_86c = local_86c + 1) {
    piVar3 = (int *)(*(long *)(local_8 + 0x71318) + (long)local_86c * 0x5d10);
    puVar4 = (undefined8 *)(local_20 + (long)local_86c * 0x58);
    iVar2 = (piVar3[3] - piVar3[2]) * (piVar3[1] - *piVar3);
    local_890 = 0;
    local_874 = local_874 + 1;
    if ((local_874 == local_4c) || (local_86c == local_44 + -1)) {
      local_890 = 1;
    }
    *(undefined4 *)(puVar4 + 8) = 0;
    *(undefined1 *)(puVar4 + 7) = local_21;
    *puVar4 = local_18;
    *(undefined4 *)((long)puVar4 + 0x3c) = 0;
    *(int *)(puVar4 + 10) = local_890;
    *(int *)((long)puVar4 + 0x54) = local_878;
    *(int *)((long)puVar4 + 0x4c) = piVar3[5];
    *(int *)(puVar4 + 9) = piVar3[4];
    *(int *)((long)puVar4 + 0x44) = iVar2;
    local_868[local_870] = iVar2 + local_868[local_870];
    if (local_878 != 0) {
      local_878 = 0;
    }
    if (local_890 != 0) {
      local_874 = 0;
      local_878 = 1;
      local_870 = local_870 + 1;
    }
  }
  memset(local_1898,0,0x1000);
  local_18a8 = *(size_t *)(local_8 + 0x9d520);
  iVar2 = *(int *)(local_38 + 0x214);
  iVar1 = *(int *)(local_38 + 0x218);
  local_86c = 0;
  local_18a0 = local_18a8;
  for (local_870 = 0; local_870 < *(int *)(local_8 + 0x9d4c4); local_870 = local_870 + 1) {
    lVar5 = local_20 + (long)local_86c * 0x58;
    sVar6 = get_bs_chunk_size(local_868[local_870],iVar2 * iVar1,&local_18a8,local_18a0,
                              (uint)(local_870 == *(int *)(local_8 + 0x9d4c4) + -1));
    *(size_t *)(local_1898 + (long)local_870 * 8) = sVar6;
    *(long *)(lVar5 + 0x20) = local_58;
    *(long *)(lVar5 + 0x28) = local_58;
    av1_write_obu_tg_tile_headers
              (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,in_stack_ffffffffffffe770,
               in_stack_ffffffffffffe76c);
    local_58 = *(long *)(local_1898 + (long)local_870 * 8) + local_58;
    *(long *)(local_1898 + (long)local_870 * 8) =
         *(long *)(local_1898 + (long)local_870 * 8) - (long)*(int *)(lVar5 + 0x40);
    local_86c = local_4c + local_86c;
  }
  local_870 = 0;
  for (local_86c = 0; local_86c < local_44; local_86c = local_86c + 1) {
    lVar5 = local_20 + (long)local_86c * 0x58;
    if (*(int *)(lVar5 + 0x54) != 0) {
      local_18a8 = *(size_t *)(local_1898 + (long)local_870 * 8);
      local_18a0 = local_18a8;
    }
    sVar6 = get_bs_chunk_size(*(int *)(lVar5 + 0x44),local_868[local_870],&local_18a8,local_18a0,
                              *(int *)(lVar5 + 0x50));
    *(size_t *)(lVar5 + 0x30) = sVar6;
    if (*(int *)(lVar5 + 0x54) == 0) {
      *(long *)(lVar5 + 0x20) = local_58;
      *(long *)(lVar5 + 0x28) = local_60;
    }
    else {
      local_58 = *(long *)(lVar5 + 0x20);
      local_60 = *(long *)(lVar5 + 0x28);
      *(long *)(lVar5 + 0x30) = (long)*(int *)(lVar5 + 0x40) + *(long *)(lVar5 + 0x30);
    }
    if (*(int *)(lVar5 + 0x50) != 0) {
      local_870 = local_870 + 1;
    }
    local_58 = *(long *)(lVar5 + 0x30) + local_58;
  }
  return;
}

Assistant:

static void init_tile_pack_bs_params(AV1_COMP *const cpi, uint8_t *const dst,
                                     struct aom_write_bit_buffer *saved_wb,
                                     PackBSParams *const pack_bs_params_arr,
                                     uint8_t obu_extn_header) {
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  const int num_tiles = tiles->cols * tiles->rows;
  // Fixed size tile groups for the moment
  const int num_tg_hdrs = cpi->num_tg;
  // Tile group size in terms of number of tiles.
  const int tg_size_in_tiles = (num_tiles + num_tg_hdrs - 1) / num_tg_hdrs;
  uint8_t *tile_dst = dst;
  uint8_t *tile_data_curr = dst;
  // Max tile group count can not be more than MAX_TILES.
  int tg_size_mi[MAX_TILES] = { 0 };  // Size of tile group in mi units
  int tile_idx;
  int tg_idx = 0;
  int tile_count_in_tg = 0;
  int new_tg = 1;

  // Populate pack bitstream params of all tiles.
  for (tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
    const TileInfo *const tile_info = &cpi->tile_data[tile_idx].tile_info;
    PackBSParams *const pack_bs_params = &pack_bs_params_arr[tile_idx];
    // Calculate tile size in mi units.
    const int tile_size_mi = (tile_info->mi_col_end - tile_info->mi_col_start) *
                             (tile_info->mi_row_end - tile_info->mi_row_start);
    int is_last_tile_in_tg = 0;
    tile_count_in_tg++;
    if (tile_count_in_tg == tg_size_in_tiles || tile_idx == (num_tiles - 1))
      is_last_tile_in_tg = 1;

    // Populate pack bitstream params of this tile.
    pack_bs_params->curr_tg_hdr_size = 0;
    pack_bs_params->obu_extn_header = obu_extn_header;
    pack_bs_params->saved_wb = saved_wb;
    pack_bs_params->obu_header_size = 0;
    pack_bs_params->is_last_tile_in_tg = is_last_tile_in_tg;
    pack_bs_params->new_tg = new_tg;
    pack_bs_params->tile_col = tile_info->tile_col;
    pack_bs_params->tile_row = tile_info->tile_row;
    pack_bs_params->tile_size_mi = tile_size_mi;
    tg_size_mi[tg_idx] += tile_size_mi;

    if (new_tg) new_tg = 0;
    if (is_last_tile_in_tg) {
      tile_count_in_tg = 0;
      new_tg = 1;
      tg_idx++;
    }
  }

  assert(cpi->available_bs_size > 0);
  size_t tg_buf_size[MAX_TILES] = { 0 };
  size_t max_buf_size = cpi->available_bs_size;
  size_t remain_buf_size = max_buf_size;
  const int frame_size_mi = cm->mi_params.mi_rows * cm->mi_params.mi_cols;

  tile_idx = 0;
  // Prepare obu, tile group and frame header of each tile group.
  for (tg_idx = 0; tg_idx < cpi->num_tg; tg_idx++) {
    PackBSParams *const pack_bs_params = &pack_bs_params_arr[tile_idx];
    int is_last_tg = tg_idx == cpi->num_tg - 1;
    // Prorate bitstream buffer size based on tile group size and available
    // buffer size. This buffer will be used to store headers and tile data.
    tg_buf_size[tg_idx] =
        get_bs_chunk_size(tg_size_mi[tg_idx], frame_size_mi, &remain_buf_size,
                          max_buf_size, is_last_tg);

    pack_bs_params->dst = tile_dst;
    pack_bs_params->tile_data_curr = tile_dst;

    // Write obu, tile group and frame header at first tile in the tile
    // group.
    av1_write_obu_tg_tile_headers(cpi, xd, pack_bs_params, tile_idx);
    tile_dst += tg_buf_size[tg_idx];

    // Exclude headers from tile group buffer size.
    tg_buf_size[tg_idx] -= pack_bs_params->curr_tg_hdr_size;
    tile_idx += tg_size_in_tiles;
  }

  tg_idx = 0;
  // Calculate bitstream buffer size of each tile in the tile group.
  for (tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
    PackBSParams *const pack_bs_params = &pack_bs_params_arr[tile_idx];

    if (pack_bs_params->new_tg) {
      max_buf_size = tg_buf_size[tg_idx];
      remain_buf_size = max_buf_size;
    }

    // Prorate bitstream buffer size of this tile based on tile size and
    // available buffer size. For this proration, header size is not accounted.
    const size_t tile_buf_size = get_bs_chunk_size(
        pack_bs_params->tile_size_mi, tg_size_mi[tg_idx], &remain_buf_size,
        max_buf_size, pack_bs_params->is_last_tile_in_tg);
    pack_bs_params->tile_buf_size = tile_buf_size;

    // Update base address of bitstream buffer for tile and tile group.
    if (pack_bs_params->new_tg) {
      tile_dst = pack_bs_params->dst;
      tile_data_curr = pack_bs_params->tile_data_curr;
      // Account header size in first tile of a tile group.
      pack_bs_params->tile_buf_size += pack_bs_params->curr_tg_hdr_size;
    } else {
      pack_bs_params->dst = tile_dst;
      pack_bs_params->tile_data_curr = tile_data_curr;
    }

    if (pack_bs_params->is_last_tile_in_tg) tg_idx++;
    tile_dst += pack_bs_params->tile_buf_size;
  }
}